

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_key.cpp
# Opt level: O3

bool __thiscall duckdb::ARTKey::operator==(ARTKey *this,ARTKey *key)

{
  idx_t iVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  
  iVar1 = this->len;
  if (iVar1 != key->len) {
    return false;
  }
  if (iVar1 != 0) {
    lVar2 = 0;
    do {
      bVar3 = this->data[lVar2] == key->data[lVar2];
      if (!bVar3) {
        return bVar3;
      }
      bVar4 = iVar1 - 1 != lVar2;
      lVar2 = lVar2 + 1;
    } while (bVar4);
    return bVar3;
  }
  return true;
}

Assistant:

bool ARTKey::operator==(const ARTKey &key) const {
	if (len != key.len) {
		return false;
	}
	for (idx_t i = 0; i < len; i++) {
		if (data[i] != key.data[i]) {
			return false;
		}
	}
	return true;
}